

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::insertRow(QFormLayout *this,int row,QWidget *label,QLayout *field)

{
  bool bVar1;
  int iVar2;
  QWidget *in_RCX;
  QLayout *in_RDX;
  undefined4 in_ESI;
  QFormLayoutPrivate *in_RDI;
  QFormLayoutPrivate *unaff_retaddr;
  QLayoutPrivate *in_stack_00000008;
  QFormLayoutPrivate *d;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_fffffffffffffff0;
  QFormLayoutPrivate *pQVar3;
  
  pQVar3 = in_RDI;
  d_func((QFormLayout *)0x4b5d9a);
  if (((in_RDX == (QLayout *)0x0) ||
      (bVar1 = QLayoutPrivate::checkWidget(in_stack_00000008,(QWidget *)unaff_retaddr), bVar1)) &&
     ((in_RCX == (QWidget *)0x0 ||
      (bVar1 = QLayoutPrivate::checkLayout
                         ((QLayoutPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX),
      bVar1)))) {
    iVar2 = QFormLayoutPrivate::insertRow(in_RDI,in_stack_ffffffffffffffcc);
    if (in_RDX != (QLayout *)0x0) {
      QFormLayoutPrivate::setWidget
                ((QFormLayoutPrivate *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                 (int)((ulong)in_RDX >> 0x20),(ItemRole)in_RDX,in_RCX);
    }
    if (in_RCX != (QWidget *)0x0) {
      QFormLayoutPrivate::setLayout
                (unaff_retaddr,(int)((ulong)pQVar3 >> 0x20),(ItemRole)pQVar3,
                 (QLayout *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
    }
    (**(code **)(*(long *)&in_RDI->super_QLayoutPrivate + 0x70))();
  }
  return;
}

Assistant:

void QFormLayout::insertRow(int row, QWidget *label, QLayout *field)
{
    Q_D(QFormLayout);
    if ((label && !d->checkWidget(label)) || (field && !d->checkLayout(field)))
        return;

    row = d->insertRow(row);
    if (label)
        d->setWidget(row, LabelRole, label);
    if (field)
        d->setLayout(row, FieldRole, field);
    invalidate();
}